

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# istack.c
# Opt level: O1

void prvTidyPopInline(TidyDocImpl *doc,Node *node)

{
  Lexer *pLVar1;
  Dict *pDVar2;
  
  pLVar1 = doc->lexer;
  if (node != (Node *)0x0) {
    pDVar2 = node->tag;
    if (pDVar2 == (Dict *)0x0) {
      return;
    }
    if ((pDVar2->model & 0x810) != 0x10) {
      return;
    }
    if (pDVar2->id == TidyTag_DEL) {
      return;
    }
    if (pDVar2->id == TidyTag_INS) {
      return;
    }
    if ((pDVar2 != (Dict *)0x0) && (pDVar2->id == TidyTag_A)) {
      do {
        if (pLVar1->istacksize == 0) {
          return;
        }
        PopIStack(doc);
      } while ((pLVar1->istack[pLVar1->istacksize].tag)->id != TidyTag_A);
      return;
    }
  }
  if ((pLVar1->istacksize != 0) &&
     (PopIStack(doc), pLVar1->istack + pLVar1->istacksize <= pLVar1->insert)) {
    pLVar1->insert = (IStack *)0x0;
  }
  return;
}

Assistant:

void TY_(PopInline)( TidyDocImpl* doc, Node *node )
{
    Lexer* lexer = doc->lexer;

    if (node)
    {
        if ( !IsNodePushable(node) )
            return;

        /* if node is </a> then pop until we find an <a> */
        if ( nodeIsA(node) )
        {
            PopIStackUntil( doc, TidyTag_A );
            return;
        }
    }

    if (lexer->istacksize > 0)
    {
        PopIStack( doc );

        /* #427822 - fix by Randy Waki 7 Aug 00 */
        if (lexer->insert >= lexer->istack + lexer->istacksize)
            lexer->insert = NULL;
    }
}